

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

ssize_t __thiscall
QTextStreamPrivate::read(QTextStreamPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  qsizetype qVar1;
  longlong *plVar2;
  undefined4 in_register_00000034;
  long lVar3;
  long in_FS_OFFSET;
  qint64 in_stack_00000020;
  QString *ret;
  QString *in_stack_ffffffffffffff48;
  QTextStreamPrivate *in_stack_ffffffffffffff50;
  bool local_99;
  qsizetype in_stack_ffffffffffffff88;
  qsizetype in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  QTextStreamPrivate *in_stack_ffffffffffffffc8;
  long local_18;
  void *local_10;
  long local_8;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  this->device = (QIODevice *)&DAT_aaaaaaaaaaaaaaaa;
  (this->deviceClosedNotifier).super_QObject._vptr_QObject = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  (this->deviceClosedNotifier).super_QObject.d_ptr.d = (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = __buf;
  QString::QString((QString *)0x4a634f);
  if (*(long *)(lVar3 + 0x20) == 0) {
    do {
      qVar1 = QString::size((QString *)(lVar3 + 0xf8));
      local_99 = false;
      if (qVar1 - *(long *)(lVar3 + 0x110) < (long)local_10) {
        local_99 = fillReadBuffer(in_stack_ffffffffffffffc8,in_stack_00000020);
      }
    } while (local_99 != false);
    QString::size((QString *)(lVar3 + 0xf8));
    plVar2 = qMin<long_long>((longlong *)&local_10,(longlong *)&stack0xffffffffffffffc8);
    *(longlong *)(lVar3 + 0x158) = *plVar2;
    QString::mid((QString *)CONCAT17(uVar4,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    QString::operator=((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x4a6508);
  }
  else {
    qVar1 = QString::size(*(QString **)(lVar3 + 0x20));
    local_18 = qVar1 - *(long *)(lVar3 + 0x28);
    plVar2 = qMin<long_long>((longlong *)&local_10,&local_18);
    *(longlong *)(lVar3 + 0x158) = *plVar2;
    QString::mid((QString *)CONCAT17(uVar4,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
    QString::operator=((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QString::~QString((QString *)0x4a63ee);
  }
  consumeLastToken(in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (ssize_t)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextStreamPrivate::read(qsizetype maxlen)
{
    QString ret;
    if (string) {
        lastTokenSize = qMin(maxlen, string->size() - stringOffset);
        ret = string->mid(stringOffset, lastTokenSize);
    } else {
        while (readBuffer.size() - readBufferOffset < maxlen && fillReadBuffer()) {}
        lastTokenSize = qMin(maxlen, readBuffer.size() - readBufferOffset);
        ret = readBuffer.mid(readBufferOffset, lastTokenSize);
    }
    consumeLastToken();

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::read() maxlen = %d, token length = %d",
           int(maxlen), int(ret.length()));
#endif
    return ret;
}